

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void __thiscall
TestMaterial::initializeUniverse
          (TestMaterial *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenameList)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  STP_BV *this_00;
  S_Polyhedron *this_01;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  string filename;
  string extension;
  double *local_90;
  double local_88;
  double local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  lVar3 = *(long *)filenameList;
  if (*(long *)(filenameList + 8) != lVar3) {
    uVar5 = 0;
    uVar7 = 1;
    do {
      local_90 = local_80;
      lVar4 = *(long *)(lVar3 + uVar5 * 0x20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,lVar4,*(long *)(lVar3 + 8 + uVar5 * 0x20) + lVar4);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
      lVar3 = std::__cxx11::string::find_last_of((char *)&local_90,0x105226,0xffffffffffffffff);
      if (lVar3 != -1) {
        std::__cxx11::string::find_last_of((char *)&local_90,0x105226,0xffffffffffffffff);
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_90);
        std::__cxx11::string::operator=((string *)local_70,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      iVar2 = std::__cxx11::string::compare((char *)local_70);
      if (iVar2 == 0) {
        this_01 = (S_Polyhedron *)operator_new(0xf0);
        sch::S_Polyhedron::S_Polyhedron(this_01);
        (**(code **)(*(long *)this_01 + 0x30))(this_01,(string *)&local_90);
        sch::CD_Scene::addObject((S_Object *)this);
      }
      else {
        this_00 = (STP_BV *)operator_new(0xe8);
        sch::STP_BV::STP_BV(this_00);
        (**(code **)(*(long *)this_00 + 0x48))(this_00,(string *)&local_90);
        sch::CD_Scene::addObject((S_Object *)this);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,(long)local_80[0] + 1);
      }
      lVar3 = *(long *)filenameList;
      bVar1 = uVar7 < (ulong)(*(long *)(filenameList + 8) - lVar3 >> 5);
      uVar5 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar1);
  }
  lVar3 = *(long *)&this->field_0x8;
  if (*(long *)&this->field_0x10 != lVar3) {
    lVar6 = -3;
    lVar4 = -2;
    uVar7 = 0;
    uVar5 = 0;
    uVar8 = 0;
    do {
      local_90 = (double *)((double)(long)(lVar4 + (uVar7 / 5) * -5) * 0.2);
      local_88 = (double)(long)(lVar6 + (uVar5 / 3 & 0xfffffffffffffffe) * -3) * 0.8333333333333334
                 * 0.2;
      local_80[0] = (double)(long)((uVar5 / 7) * -7 + lVar6) * 0.7142857142857143 * 0.2;
      sch::S_Object::setPosition(*(Vector3T **)(lVar3 + uVar8 * 8));
      uVar8 = uVar8 + 1;
      lVar3 = *(long *)&this->field_0x8;
      lVar6 = lVar6 + 5;
      uVar5 = uVar5 + 5;
      lVar4 = lVar4 + 7;
      uVar7 = uVar7 + 7;
    } while (uVar8 < (ulong)(*(long *)&this->field_0x10 - lVar3 >> 3));
  }
  sch::CD_Scene::sceneProximityQuery();
  return;
}

Assistant:

void TestMaterial::initializeUniverse(const std::vector<std::string> & filenameList)
{
  for(unsigned i=0; i<filenameList.size(); ++i)
  {
    std::string filename = filenameList[i];
    std::string extension = "";
    if(filename.find_last_of(".") != std::string::npos)
    {
      extension = filename.substr(filename.find_last_of(".")+1);
    }
    if(extension == "otp")
    {
      S_Polyhedron* s = new S_Polyhedron();
      s->constructFromFile(filename);
      sObj.addObject(s);
    }
    else //if(extension == "txt")
    {
      STP_BV* s = new STP_BV();
      s->constructFromFileWithGL(filename);
      sObj.addObject(s);
    }
  }

  for (size_t i=0; i<sObj.size(); i++)
  {
    Vector3 position(
      Scalar(7*i%5)-2.,
      (Scalar(5*i%6)-3.)*(5.0/6.),
      (Scalar(5*i%7)-3.)*(5.0/7.)
    );
    position *= DispersionScale;
    sObj[i]->setPosition(position);
  }

  DoTest();
}